

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   bool value)

{
  OptionRecord *pOVar1;
  OptionStatus OVar2;
  OptionStatus OVar3;
  undefined8 in_RAX;
  HighsInt index;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  OVar2 = getOptionIndex(report_log_options,name,option_records,&local_24);
  OVar3 = kUnknownOption;
  if (OVar2 == kOk) {
    pOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[local_24];
    if (pOVar1->type == kBool) {
      *(bool *)pOVar1[1]._vptr_OptionRecord = value;
      OVar3 = kOk;
    }
    else {
      highsLogUser(report_log_options,kError,
                   "setLocalOptionValue: Option \"%s\" cannot be assigned a bool\n",
                   (name->_M_dataplus)._M_p);
      OVar3 = kIllegalValue;
    }
  }
  return OVar3;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const bool value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with bool %" HIGHSINT_FORMAT "\n",
  //  name.c_str(), value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kBool) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned a bool\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(((OptionRecordBool*)option_records[index])[0],
                             value);
}